

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O1

Option * __thiscall
despot::PlannerBase::InitializeParamers
          (PlannerBase *this,int argc,char **argv,string *solver_type,bool *search_solver,
          int *num_runs,string *world_type,string *belief_type,int *time_limit)

{
  long lVar1;
  undefined8 *puVar2;
  ulong uVar3;
  uint seed;
  char *__s;
  Option *options;
  Option *buffer;
  size_t sVar4;
  ulong uVar5;
  int argc_00;
  PlannerBase *this_00;
  Stats stats;
  IStringWriter local_58;
  long *local_50;
  Parser parse;
  
  gettimeofday((timeval *)&parse,(__timezone_ptr_t)0x0);
  EvalLog::curr_inst_start_time =
       (double)(long)parse.nonop_args / 1000000.0 + (double)(long)parse._0_8_;
  if (argc < 1) {
    __s = "despot";
  }
  else {
    __s = *argv;
  }
  argc_00 = argc - (uint)(0 < argc);
  option::Stats::Stats(&stats,this->usage,argc_00,argv + (0 < argc_00),0,false);
  uVar3 = (ulong)stats.options_max * 0x30;
  options = (Option *)operator_new__(uVar3);
  if ((ulong)stats.options_max != 0) {
    uVar5 = 0;
    do {
      lVar1 = (long)&options->next_ + uVar5 + 1;
      puVar2 = (undefined8 *)((long)&options->name + uVar5 + 4);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)&options->desc + uVar5);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(long *)((long)&options->prev_ + uVar5) = lVar1;
      *(long *)((long)&options->next_ + uVar5) = lVar1;
      uVar5 = uVar5 + 0x30;
    } while (uVar3 != uVar5);
  }
  uVar3 = (ulong)stats.buffer_max * 0x30;
  buffer = (Option *)operator_new__(uVar3);
  if ((ulong)stats.buffer_max != 0) {
    uVar5 = 0;
    do {
      lVar1 = (long)&buffer->next_ + uVar5 + 1;
      puVar2 = (undefined8 *)((long)&buffer->name + uVar5 + 4);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)&buffer->desc + uVar5);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(long *)((long)&buffer->prev_ + uVar5) = lVar1;
      *(long *)((long)&buffer->next_ + uVar5) = lVar1;
      uVar5 = uVar5 + 0x30;
    } while (uVar3 != uVar5);
  }
  option::Parser::Parser(&parse,this->usage,argc_00,argv + (0 < argc_00),options,buffer,0,false,-1);
  this_00 = this;
  (*this->_vptr_PlannerBase[4])();
  if (options[1].desc == (Descriptor *)0x0) {
    OptionParse(this_00,options,num_runs,world_type,belief_type,time_limit,solver_type,search_solver
               );
    Seeds::root_seed(DAT_00193e00);
    seed = Seeds::Next();
    Random::Random((Random *)&local_58,seed);
    Random::RANDOM = local_58._vptr_IStringWriter._0_4_;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x195310);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [options]",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    local_58._vptr_IStringWriter = (_func_int **)&PTR__IStringWriter_00190f98;
    local_50 = &std::cout;
    option::PrintUsageImplementation::printUsage(&local_58,this->usage,0x50,0x32,0x4b);
    options = (Option *)0x0;
  }
  return options;
}

Assistant:

option::Option* PlannerBase::InitializeParamers(int argc, char *argv[],
		std::string& solver_type, bool& search_solver, int& num_runs,
		std::string& world_type, std::string& belief_type, int& time_limit) {
	EvalLog::curr_inst_start_time = get_time_second();

	const char *program = (argc > 0) ? argv[0] : "despot";

	argc -= (argc > 0);
	argv += (argc > 0); // skip program name argv[0] if present

	option::Stats stats(usage, argc, argv);
	option::Option *options = new option::Option[stats.options_max];
	option::Option *buffer = new option::Option[stats.buffer_max];
	option::Parser parse(usage, argc, argv, options, buffer);

	/* =========================================
	 * Problem specific default parameter values
	 *=========================================*/
	InitializeDefaultParameters();

	/* =========================
	 * Parse optional parameters
	 * =========================*/
	if (options[E_HELP]) {
		cout << "Usage: " << program << " [options]" << endl;
		option::printUsage(std::cout, usage);
		return NULL;
	}
	OptionParse(options, num_runs, world_type, belief_type, time_limit,
			solver_type, search_solver);

	/* =========================
	 * Global random generator
	 * =========================*/
	Seeds::root_seed(Globals::config.root_seed);
	//unsigned world_seed = Seeds::Next();
	unsigned seed = Seeds::Next();
	Random::RANDOM = Random(seed);

	return options;
}